

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::CopyRemovePolicy(CopyRemovePolicy<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
                   *this,List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                         *list)

{
  List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *list_local;
  CopyRemovePolicy<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  *this_local;
  
  return;
}

Assistant:

void Remove(TListType* list, const TElementType& item)
        {
            TElementType* buffer = list->buffer;
            int& count = list->count;

            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(buffer[i], item))
                {
                    for (int j = i + 1; j < count; i++, j++)
                    {
                        buffer[i] = buffer[j];
                    }
                    count--;

                    if (clearOldEntries)
                    {
                        ClearArray(buffer + count, 1);
                    }
                    break;
                }
            }
        }